

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall kratos::StatementGraph::StatementGraph(StatementGraph *this,Generator *generator)

{
  (this->nodes_)._M_h._M_buckets = &(this->nodes_)._M_h._M_single_bucket;
  (this->nodes_)._M_h._M_bucket_count = 1;
  (this->nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes_)._M_h._M_element_count = 0;
  (this->nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->root_ = generator;
  build_graph(this);
  return;
}

Assistant:

StatementGraph::StatementGraph(Generator *generator) : root_(generator) {
    // build the control flow graph
    build_graph();
}